

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * ghc::filesystem::relative(path *__return_storage_ptr__,path *p,path *base)

{
  path local_60;
  path local_40;
  path *local_20;
  path *base_local;
  path *p_local;
  
  local_20 = base;
  base_local = p;
  p_local = __return_storage_ptr__;
  weakly_canonical(&local_40,p);
  weakly_canonical(&local_60,local_20);
  path::lexically_relative(__return_storage_ptr__,&local_40,&local_60);
  path::~path(&local_60);
  path::~path(&local_40);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path relative(const path& p, const path& base)
{
    return weakly_canonical(p).lexically_relative(weakly_canonical(base));
}